

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::SystemTimingCheckSymbol::serializeTo
          (SystemTimingCheckSymbol *this,ASTSerializer *serializer)

{
  pointer pAVar1;
  pointer pAVar2;
  Arg *arg;
  array<char,_2UL> *desc;
  pointer paVar3;
  long lVar4;
  string_view sVar5;
  span<const_slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL> sVar6;
  string_view name;
  string_view value;
  
  sVar5 = ast::toString(this->timingCheckKind);
  ASTSerializer::write(serializer,0xf,"timingCheckKind",sVar5._M_len);
  sVar5._M_str = "arguments";
  sVar5._M_len = 9;
  ASTSerializer::startArray(serializer,sVar5);
  sVar6 = getArguments(this);
  pAVar1 = sVar6._M_ptr;
  pAVar2 = pAVar1 + sVar6._M_extent._M_extent_value._M_extent_value;
  for (; pAVar1 != pAVar2; pAVar1 = pAVar1 + 1) {
    ASTSerializer::startObject(serializer);
    if (pAVar1->expr != (Expression *)0x0) {
      ASTSerializer::write(serializer,4,"expr",(size_t)pAVar1->expr);
    }
    if (pAVar1->condition != (Expression *)0x0) {
      ASTSerializer::write(serializer,9,"condition",(size_t)pAVar1->condition);
    }
    if (pAVar1->edge != None) {
      sVar5 = ast::toString(pAVar1->edge);
      ASTSerializer::write(serializer,4,"edge",sVar5._M_len);
    }
    if ((pAVar1->edgeDescriptors)._M_extent._M_extent_value != 0) {
      name._M_str = "edgeDescriptors";
      name._M_len = 0xf;
      ASTSerializer::startArray(serializer,name);
      paVar3 = (pAVar1->edgeDescriptors)._M_ptr;
      for (lVar4 = (pAVar1->edgeDescriptors)._M_extent._M_extent_value * 2; lVar4 != 0;
          lVar4 = lVar4 + -2) {
        value._M_str = paVar3->_M_elems;
        value._M_len = 2;
        ASTSerializer::serialize(serializer,value);
        paVar3 = paVar3 + 1;
      }
      ASTSerializer::endArray(serializer);
    }
    ASTSerializer::endObject(serializer);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void SystemTimingCheckSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("timingCheckKind", toString(timingCheckKind));

    serializer.startArray("arguments");
    for (auto& arg : getArguments()) {
        serializer.startObject();
        if (arg.expr)
            serializer.write("expr", *arg.expr);
        if (arg.condition)
            serializer.write("condition", *arg.condition);
        if (arg.edge != EdgeKind::None)
            serializer.write("edge", toString(arg.edge));

        if (!arg.edgeDescriptors.empty()) {
            serializer.startArray("edgeDescriptors");
            for (auto& desc : arg.edgeDescriptors)
                serializer.serialize(std::string_view(desc.data(), desc.size()));
            serializer.endArray();
        }

        serializer.endObject();
    }
    serializer.endArray();
}